

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

Matrix<float> __thiscall gnns::load_from_file<float>(gnns *this,string *file_name)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  char *__filename;
  GnnsException *pGVar3;
  ulong uVar4;
  float *extraout_RDX;
  Matrix<float> MVar5;
  bad_alloc *ba;
  int dim_;
  int i;
  float *vecs;
  int local_a0;
  int col;
  int col_size;
  int dim;
  allocator local_81;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  FILE *local_20;
  FILE *fp;
  string *file_name_local;
  
  fp = (FILE *)file_name;
  file_name_local = (string *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"load_from_file ");
  poVar2 = std::operator<<(poVar2,(string *)fp);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __filename = (char *)std::__cxx11::string::c_str();
  local_20 = fopen(__filename,"rb");
  if (local_20 == (FILE *)0x0) {
    col_size._3_1_ = 1;
    pGVar3 = (GnnsException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"File ",&local_81);
    std::operator+(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80);
    std::operator+(local_40,(char *)local_60);
    GnnsException::GnnsException(pGVar3,local_40);
    col_size._3_1_ = 0;
    __cxa_throw(pGVar3,&GnnsException::typeinfo,GnnsException::~GnnsException);
  }
  fread(&col,4,1,local_20);
  local_a0 = col * 4 + 4;
  fseek(local_20,0,2);
  uVar4 = ftell(local_20);
  vecs._4_4_ = (size_t_conflict)
               ((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
               (long)local_a0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)(col * vecs._4_4_);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  _dim_ = (float *)operator_new__(uVar4);
  fseek(local_20,0,0);
  ba._4_4_ = 0;
  while( true ) {
    if ((int)vecs._4_4_ <= ba._4_4_) {
      fclose(local_20);
      Matrix<float>::Matrix((Matrix<float> *)this,_dim_,vecs._4_4_,col);
      MVar5.data = extraout_RDX;
      MVar5._0_8_ = this;
      return MVar5;
    }
    fread(&ba,4,1,local_20);
    if ((int)ba != col) break;
    fread(_dim_ + ba._4_4_ * col,4,(long)col,local_20);
    ba._4_4_ = ba._4_4_ + 1;
  }
  pGVar3 = (GnnsException *)__cxa_allocate_exception(0x10);
  GnnsException::GnnsException(pGVar3,"The dimensions of all rows are NOT same!\n");
  __cxa_throw(pGVar3,&GnnsException::typeinfo,GnnsException::~GnnsException);
}

Assistant:

Matrix<T> load_from_file(const std::string& file_name)
    {
        std::cout << "load_from_file " << file_name << std::endl;

        FILE *fp = fopen(file_name.c_str(), "rb");

        if (fp == NULL)
        {
            throw GnnsException(std::string("File ") + file_name + "is NOT exist!\n");
        }

        //read the vector dimension
        int dim;
        fread(&dim, 4, 1, fp);

        int col_size = 1 * 4 + sizeof(T) * dim;
        fseek(fp, 0, SEEK_END);
        int col = int(ftell(fp)) / col_size;

        //allocate memory for the vectors
        try {
            T* vecs = new T[dim * col];
            fseek(fp, 0, SEEK_SET);
            for (int i = 0; i < col; ++i)
            {
                int dim_;
                fread(&dim_, 4, 1, fp);
                if (dim_ != dim)
                {
                    throw GnnsException("The dimensions of all rows are NOT same!\n");
                }
                fread(vecs + i * dim, sizeof(T), dim, fp);
            }
            fclose(fp);

            return Matrix<T>(vecs, col, dim);
        } catch (const std::bad_alloc &ba) {
            throw ba;
        }
    }